

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_bone.cxx
# Opt level: O1

void __thiscall xray_re::xr_bone::load_data(xr_bone *this,xr_reader *r)

{
  undefined8 *puVar1;
  uint32_t uVar2;
  uint8_t *puVar3;
  float *pfVar4;
  undefined8 uVar5;
  size_t sVar6;
  long lVar7;
  uint32_t *puVar8;
  s_bone_shape *psVar9;
  byte bVar10;
  
  bVar10 = 0;
  sVar6 = xr_reader::find_chunk(r,2,(bool *)0x0,false);
  if (sVar6 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_bone.cxx"
                  ,0x40,"void xray_re::xr_bone::load_data(xr_reader &)");
  }
  xr_reader::r_sz(r,&this->m_name);
  sVar6 = xr_reader::find_chunk(r,4);
  if (sVar6 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_bone.cxx"
                  ,0x45,"void xray_re::xr_bone::load_data(xr_reader &)");
  }
  xr_reader::r_sz(r,&this->m_gamemtl);
  sVar6 = xr_reader::find_chunk(r,5);
  if (sVar6 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_bone.cxx"
                  ,0x4a,"void xray_re::xr_bone::load_data(xr_reader &)");
  }
  puVar8 = (r->field_2).m_p_u32;
  psVar9 = &this->m_shape;
  for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
    uVar2 = *puVar8;
    psVar9->type = (short)uVar2;
    psVar9->flags = (short)(uVar2 >> 0x10);
    puVar8 = puVar8 + (ulong)bVar10 * -2 + 1;
    psVar9 = (s_bone_shape *)((long)psVar9 + (ulong)bVar10 * -8 + 4);
  }
  (r->field_2).m_p = (r->field_2).m_p + 0x70;
  sVar6 = xr_reader::find_chunk(r,8);
  if (sVar6 != 0) {
    puVar8 = (r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(puVar8 + 1);
    (this->m_joint_ik_data).ik_flags = *puVar8;
  }
  sVar6 = xr_reader::find_chunk(r,6);
  if (sVar6 != 0) {
    puVar8 = (r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(puVar8 + 1);
    (this->m_joint_ik_data).type = *puVar8;
    lVar7 = 0;
    do {
      uVar5 = *(undefined8 *)((r->field_2).m_p + 8);
      puVar1 = (undefined8 *)((long)&(this->m_joint_ik_data).limits[0].limit.field_0 + lVar7);
      *puVar1 = *(undefined8 *)(r->field_2).m_p;
      puVar1[1] = uVar5;
      puVar3 = (r->field_2).m_p;
      (r->field_2).m_p = puVar3 + 0x10;
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x30);
    (r->field_2).m_p = puVar3 + 0x14;
    (this->m_joint_ik_data).spring_factor = *(float *)(puVar3 + 0x10);
    pfVar4 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar4 + 1);
    (this->m_joint_ik_data).damping_factor = *pfVar4;
    sVar6 = xr_reader::find_chunk(r,9);
    if (sVar6 != 0) {
      pfVar4 = (float *)(r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(pfVar4 + 1);
      (this->m_joint_ik_data).break_force = *pfVar4;
      pfVar4 = (float *)(r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(pfVar4 + 1);
      (this->m_joint_ik_data).break_torque = *pfVar4;
    }
    sVar6 = xr_reader::find_chunk(r,0x10);
    if (sVar6 != 0) {
      pfVar4 = (float *)(r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(pfVar4 + 1);
      (this->m_joint_ik_data).friction = *pfVar4;
    }
    sVar6 = xr_reader::find_chunk(r,7);
    if (sVar6 != 0) {
      pfVar4 = (float *)(r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(pfVar4 + 1);
      this->m_mass = *pfVar4;
      pfVar4 = (float *)(r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(pfVar4 + 1);
      (this->m_center_of_mass).field_0.field_0.x = *pfVar4;
      pfVar4 = (float *)(r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(pfVar4 + 1);
      (this->m_center_of_mass).field_0.field_0.y = *pfVar4;
      pfVar4 = (float *)(r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(pfVar4 + 1);
      (this->m_center_of_mass).field_0.field_0.z = *pfVar4;
    }
    return;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_bone.cxx"
                ,0x54,"void xray_re::xr_bone::load_data(xr_reader &)");
}

Assistant:

void xr_bone::load_data(xr_reader& r)
{
	if (!r.find_chunk(BONE_CHUNK_DEF, 0, false))
		xr_not_expected();
	r.r_sz(m_name);
	r.debug_find_chunk();

	if (!r.find_chunk(BONE_CHUNK_MATERIAL))
		xr_not_expected();
	r.r_sz(m_gamemtl);
	r.debug_find_chunk();

	if (!r.find_chunk(BONE_CHUNK_SHAPE))
		xr_not_expected();
	r.r<s_bone_shape>(m_shape);
	r.debug_find_chunk();

	if (r.find_chunk(BONE_CHUNK_IK_FLAGS)) {
		m_joint_ik_data.ik_flags = r.r_u32();
		r.debug_find_chunk();
	}

	if (!r.find_chunk(BONE_CHUNK_IK_JOINT))
		xr_not_expected();
	m_joint_ik_data.type = r.r_u32();
	r.r_cseq<s_joint_limit>(3, m_joint_ik_data.limits);
	m_joint_ik_data.spring_factor = r.r_float();
	m_joint_ik_data.damping_factor = r.r_float();
	r.debug_find_chunk();

	if (r.find_chunk(BONE_CHUNK_BREAK_PARAMS)) {
		m_joint_ik_data.break_force = r.r_float();
		m_joint_ik_data.break_torque = r.r_float();
		r.debug_find_chunk();
	}

	if (r.find_chunk(BONE_CHUNK_FRICTION)) {
		m_joint_ik_data.friction = r.r_float();
		r.debug_find_chunk();
	}

	if (r.find_chunk(BONE_CHUNK_MASS_PARAMS)) {
		m_mass = r.r_float();
		r.r_fvector3(m_center_of_mass);
		r.debug_find_chunk();
	}
}